

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reductors.cpp
# Opt level: O3

void opengv::absolute_pose::modules::gpnp5::groebnerRow9_01000_f
               (Matrix<double,_44,_80,_0,_44,_80> *groebnerMatrix,int targetRow)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  long lVar17;
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  
  lVar17 = (long)targetRow;
  auVar19._8_8_ = 0;
  auVar19._0_8_ =
       (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_44,_80,_0,_44,_80>_>).m_storage.
       m_data.array[lVar17 + 0x688];
  auVar16._8_8_ = 0x8000000000000000;
  auVar16._0_8_ = 0x8000000000000000;
  auVar18 = vxorpd_avx512vl(auVar19,auVar16);
  auVar20._0_8_ =
       auVar18._0_8_ /
       (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_44,_80,_0,_44,_80>_>).m_storage.
       m_data.array[0xadd];
  auVar20._8_8_ = auVar18._8_8_;
  (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_44,_80,_0,_44,_80>_>).m_storage.
  m_data.array[lVar17 + 0x688] = 0.0;
  auVar21._8_8_ = 0;
  auVar21._0_8_ =
       (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_44,_80,_0,_44,_80>_>).m_storage.
       m_data.array[0xb09];
  auVar18._8_8_ = 0;
  auVar18._0_8_ =
       (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_44,_80,_0,_44,_80>_>).m_storage.
       m_data.array[lVar17 + 0x6b4];
  auVar18 = vfmadd213sd_fma(auVar21,auVar20,auVar18);
  (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_44,_80,_0,_44,_80>_>).m_storage.
  m_data.array[lVar17 + 0x6b4] = auVar18._0_8_;
  auVar22._8_8_ = 0;
  auVar22._0_8_ =
       (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_44,_80,_0,_44,_80>_>).m_storage.
       m_data.array[0xb35];
  auVar1._8_8_ = 0;
  auVar1._0_8_ = (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_44,_80,_0,_44,_80>_>).
                 m_storage.m_data.array[lVar17 + 0x6e0];
  auVar18 = vfmadd213sd_fma(auVar22,auVar20,auVar1);
  (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_44,_80,_0,_44,_80>_>).m_storage.
  m_data.array[lVar17 + 0x6e0] = auVar18._0_8_;
  auVar23._8_8_ = 0;
  auVar23._0_8_ =
       (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_44,_80,_0,_44,_80>_>).m_storage.
       m_data.array[0xb61];
  auVar2._8_8_ = 0;
  auVar2._0_8_ = (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_44,_80,_0,_44,_80>_>).
                 m_storage.m_data.array[lVar17 + 0x70c];
  auVar18 = vfmadd213sd_fma(auVar23,auVar20,auVar2);
  (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_44,_80,_0,_44,_80>_>).m_storage.
  m_data.array[lVar17 + 0x70c] = auVar18._0_8_;
  auVar24._8_8_ = 0;
  auVar24._0_8_ =
       (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_44,_80,_0,_44,_80>_>).m_storage.
       m_data.array[0xb8d];
  auVar3._8_8_ = 0;
  auVar3._0_8_ = (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_44,_80,_0,_44,_80>_>).
                 m_storage.m_data.array[lVar17 + 0x738];
  auVar18 = vfmadd213sd_fma(auVar24,auVar20,auVar3);
  (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_44,_80,_0,_44,_80>_>).m_storage.
  m_data.array[lVar17 + 0x738] = auVar18._0_8_;
  auVar25._8_8_ = 0;
  auVar25._0_8_ =
       (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_44,_80,_0,_44,_80>_>).m_storage.
       m_data.array[0xbb9];
  auVar4._8_8_ = 0;
  auVar4._0_8_ = (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_44,_80,_0,_44,_80>_>).
                 m_storage.m_data.array[lVar17 + 0x764];
  auVar18 = vfmadd213sd_fma(auVar25,auVar20,auVar4);
  (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_44,_80,_0,_44,_80>_>).m_storage.
  m_data.array[lVar17 + 0x764] = auVar18._0_8_;
  auVar26._8_8_ = 0;
  auVar26._0_8_ =
       (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_44,_80,_0,_44,_80>_>).m_storage.
       m_data.array[0xbe5];
  auVar5._8_8_ = 0;
  auVar5._0_8_ = (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_44,_80,_0,_44,_80>_>).
                 m_storage.m_data.array[lVar17 + 0x898];
  auVar18 = vfmadd213sd_fma(auVar26,auVar20,auVar5);
  (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_44,_80,_0,_44,_80>_>).m_storage.
  m_data.array[lVar17 + 0x898] = auVar18._0_8_;
  auVar27._8_8_ = 0;
  auVar27._0_8_ =
       (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_44,_80,_0,_44,_80>_>).m_storage.
       m_data.array[0xc11];
  auVar6._8_8_ = 0;
  auVar6._0_8_ = (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_44,_80,_0,_44,_80>_>).
                 m_storage.m_data.array[lVar17 + 0x8c4];
  auVar18 = vfmadd213sd_fma(auVar27,auVar20,auVar6);
  (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_44,_80,_0,_44,_80>_>).m_storage.
  m_data.array[lVar17 + 0x8c4] = auVar18._0_8_;
  auVar28._8_8_ = 0;
  auVar28._0_8_ =
       (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_44,_80,_0,_44,_80>_>).m_storage.
       m_data.array[0xc3d];
  auVar7._8_8_ = 0;
  auVar7._0_8_ = (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_44,_80,_0,_44,_80>_>).
                 m_storage.m_data.array[lVar17 + 0x8f0];
  auVar18 = vfmadd213sd_fma(auVar28,auVar20,auVar7);
  (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_44,_80,_0,_44,_80>_>).m_storage.
  m_data.array[lVar17 + 0x8f0] = auVar18._0_8_;
  auVar29._8_8_ = 0;
  auVar29._0_8_ =
       (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_44,_80,_0,_44,_80>_>).m_storage.
       m_data.array[0xc69];
  auVar8._8_8_ = 0;
  auVar8._0_8_ = (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_44,_80,_0,_44,_80>_>).
                 m_storage.m_data.array[lVar17 + 0x91c];
  auVar18 = vfmadd213sd_fma(auVar29,auVar20,auVar8);
  (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_44,_80,_0,_44,_80>_>).m_storage.
  m_data.array[lVar17 + 0x91c] = auVar18._0_8_;
  auVar30._8_8_ = 0;
  auVar30._0_8_ =
       (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_44,_80,_0,_44,_80>_>).m_storage.
       m_data.array[0xc95];
  auVar9._8_8_ = 0;
  auVar9._0_8_ = (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_44,_80,_0,_44,_80>_>).
                 m_storage.m_data.array[lVar17 + 0x9cc];
  auVar18 = vfmadd213sd_fma(auVar30,auVar20,auVar9);
  (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_44,_80,_0,_44,_80>_>).m_storage.
  m_data.array[lVar17 + 0x9cc] = auVar18._0_8_;
  auVar31._8_8_ = 0;
  auVar31._0_8_ =
       (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_44,_80,_0,_44,_80>_>).m_storage.
       m_data.array[0xcc1];
  auVar10._8_8_ = 0;
  auVar10._0_8_ =
       (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_44,_80,_0,_44,_80>_>).m_storage.
       m_data.array[lVar17 + 0xb2c];
  auVar18 = vfmadd213sd_fma(auVar31,auVar20,auVar10);
  (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_44,_80,_0,_44,_80>_>).m_storage.
  m_data.array[lVar17 + 0xb2c] = auVar18._0_8_;
  auVar32._8_8_ = 0;
  auVar32._0_8_ =
       (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_44,_80,_0,_44,_80>_>).m_storage.
       m_data.array[0xced];
  auVar11._8_8_ = 0;
  auVar11._0_8_ =
       (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_44,_80,_0,_44,_80>_>).m_storage.
       m_data.array[lVar17 + 0xb58];
  auVar18 = vfmadd213sd_fma(auVar32,auVar20,auVar11);
  (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_44,_80,_0,_44,_80>_>).m_storage.
  m_data.array[lVar17 + 0xb58] = auVar18._0_8_;
  auVar33._8_8_ = 0;
  auVar33._0_8_ =
       (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_44,_80,_0,_44,_80>_>).m_storage.
       m_data.array[0xd19];
  auVar12._8_8_ = 0;
  auVar12._0_8_ =
       (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_44,_80,_0,_44,_80>_>).m_storage.
       m_data.array[lVar17 + 0xb84];
  auVar18 = vfmadd213sd_fma(auVar33,auVar20,auVar12);
  (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_44,_80,_0,_44,_80>_>).m_storage.
  m_data.array[lVar17 + 0xb84] = auVar18._0_8_;
  auVar34._8_8_ = 0;
  auVar34._0_8_ =
       (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_44,_80,_0,_44,_80>_>).m_storage.
       m_data.array[0xd45];
  auVar13._8_8_ = 0;
  auVar13._0_8_ =
       (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_44,_80,_0,_44,_80>_>).m_storage.
       m_data.array[lVar17 + 0xbb0];
  auVar18 = vfmadd213sd_fma(auVar34,auVar20,auVar13);
  (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_44,_80,_0,_44,_80>_>).m_storage.
  m_data.array[lVar17 + 0xbb0] = auVar18._0_8_;
  auVar35._8_8_ = 0;
  auVar35._0_8_ =
       (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_44,_80,_0,_44,_80>_>).m_storage.
       m_data.array[0xd71];
  auVar14._8_8_ = 0;
  auVar14._0_8_ =
       (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_44,_80,_0,_44,_80>_>).m_storage.
       m_data.array[lVar17 + 0xc60];
  auVar18 = vfmadd213sd_fma(auVar35,auVar20,auVar14);
  (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_44,_80,_0,_44,_80>_>).m_storage.
  m_data.array[lVar17 + 0xc60] = auVar18._0_8_;
  auVar36._8_8_ = 0;
  auVar36._0_8_ =
       (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_44,_80,_0,_44,_80>_>).m_storage.
       m_data.array[0xd9d];
  auVar15._8_8_ = 0;
  auVar15._0_8_ =
       (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_44,_80,_0,_44,_80>_>).m_storage.
       m_data.array[lVar17 + 0xd3c];
  auVar18 = vfmadd213sd_fma(auVar36,auVar20,auVar15);
  (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_44,_80,_0,_44,_80>_>).m_storage.
  m_data.array[lVar17 + 0xd3c] = auVar18._0_8_;
  return;
}

Assistant:

void
opengv::absolute_pose::modules::gpnp5::groebnerRow9_01000_f( Eigen::Matrix<double,44,80> & groebnerMatrix, int targetRow )
{
  double factor = groebnerMatrix(targetRow,38) / groebnerMatrix(9,63);
  groebnerMatrix(targetRow,38) = 0.0;
  groebnerMatrix(targetRow,39) -= factor * groebnerMatrix(9,64);
  groebnerMatrix(targetRow,40) -= factor * groebnerMatrix(9,65);
  groebnerMatrix(targetRow,41) -= factor * groebnerMatrix(9,66);
  groebnerMatrix(targetRow,42) -= factor * groebnerMatrix(9,67);
  groebnerMatrix(targetRow,43) -= factor * groebnerMatrix(9,68);
  groebnerMatrix(targetRow,50) -= factor * groebnerMatrix(9,69);
  groebnerMatrix(targetRow,51) -= factor * groebnerMatrix(9,70);
  groebnerMatrix(targetRow,52) -= factor * groebnerMatrix(9,71);
  groebnerMatrix(targetRow,53) -= factor * groebnerMatrix(9,72);
  groebnerMatrix(targetRow,57) -= factor * groebnerMatrix(9,73);
  groebnerMatrix(targetRow,65) -= factor * groebnerMatrix(9,74);
  groebnerMatrix(targetRow,66) -= factor * groebnerMatrix(9,75);
  groebnerMatrix(targetRow,67) -= factor * groebnerMatrix(9,76);
  groebnerMatrix(targetRow,68) -= factor * groebnerMatrix(9,77);
  groebnerMatrix(targetRow,72) -= factor * groebnerMatrix(9,78);
  groebnerMatrix(targetRow,77) -= factor * groebnerMatrix(9,79);
}